

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::ValidateToken
          (Error *__return_storage_ptr__,TokenManager *this,CborMap *aToken,ByteArray *aSignedToken,
          mbedtls_pk_context_conflict *aPublicKey)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  Error *pEVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  allocator local_519;
  string local_518 [38];
  anon_class_1_0_00000001 local_4f2;
  v10 local_4f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  char *local_4e8;
  string local_4e0;
  Error local_4c0;
  allocator local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  ErrorCode local_46c;
  Error local_468;
  ErrorCode local_43c;
  Error local_438;
  ErrorCode local_40c;
  Error local_408;
  anon_class_1_0_00000001 local_3da;
  v10 local_3d9;
  v10 *local_3d8;
  size_t local_3d0;
  string local_3c8;
  Error local_3a8;
  ErrorCode local_37c;
  Error local_378;
  ErrorCode local_34c;
  Error local_348;
  anon_class_1_0_00000001 local_31a;
  v10 local_319;
  v10 *local_318;
  size_t local_310;
  string local_308;
  Error local_2e8;
  size_t local_2c0;
  size_t expireLength;
  char *expire;
  size_t domainNameLength;
  char *domainName;
  size_t payloadLength;
  uint8_t *payload;
  CborMap token;
  undefined1 local_268 [8];
  Sign1Message coseSign;
  mbedtls_pk_context_conflict *aPublicKey_local;
  ByteArray *aSignedToken_local;
  CborMap *aToken_local;
  TokenManager *this_local;
  Error *error;
  undefined1 local_210 [16];
  v10 *local_200;
  ulong local_1f8;
  v10 *local_1f0;
  size_t sStack_1e8;
  string *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1d8 [3];
  undefined1 local_1c0 [16];
  v10 *local_1b0;
  ulong local_1a8;
  v10 *local_1a0;
  size_t sStack_198;
  string *local_190;
  v10 *local_188;
  v10 **local_180;
  v10 *local_178;
  v10 **local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  undefined1 local_148 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *local_130;
  string *local_128;
  v10 *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  char *pcStack_110;
  string *local_108;
  v10 *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  v10 **local_d0;
  v10 *local_c8;
  size_t sStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  Error **local_88;
  undefined1 *local_80;
  Error **local_78;
  undefined8 local_70;
  undefined1 *local_68;
  Error **local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  coseSign.mSign._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  cose::Sign1Message::Sign1Message((Sign1Message *)local_268);
  CborMap::CborMap((CborMap *)&payload);
  bVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(aSignedToken);
  if (bVar3) {
    ValidateToken::anon_class_1_0_00000001::operator()(&local_31a);
    local_180 = &local_318;
    local_188 = &local_319;
    bVar5 = ::fmt::v10::operator()(local_188);
    local_310 = bVar5.size_;
    local_318 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_190 = &local_308;
    local_1a0 = local_318;
    sStack_198 = local_310;
    local_f0 = &local_1a0;
    local_1b0 = local_318;
    local_1a8 = local_310;
    local_e8 = local_1b0;
    sStack_e0 = local_1a8;
    local_1d8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_a8 = local_1c0;
    local_b0 = local_1d8;
    local_98 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_b0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1a8;
    local_a0 = local_b0;
    local_90 = local_a8;
    local_58 = local_b0;
    ::fmt::v10::vformat_abi_cxx11_(&local_308,local_1b0,fmt,args);
    Error::Error(&local_2e8,kInvalidArgs,&local_308);
    Error::operator=(__return_storage_ptr__,&local_2e8);
    Error::~Error(&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
  }
  else {
    cose::Sign1Message::Deserialize(&local_348,(Sign1Message *)local_268,aSignedToken);
    pEVar4 = Error::operator=(__return_storage_ptr__,&local_348);
    local_34c = kNone;
    bVar3 = commissioner::operator!=(pEVar4,&local_34c);
    Error::~Error(&local_348);
    if (!bVar3) {
      cose::Sign1Message::Validate
                (&local_378,(Sign1Message *)local_268,(mbedtls_pk_context *)aPublicKey);
      pEVar4 = Error::operator=(__return_storage_ptr__,&local_378);
      local_37c = kNone;
      bVar3 = commissioner::operator!=(pEVar4,&local_37c);
      Error::~Error(&local_378);
      if (!bVar3) {
        payloadLength =
             (size_t)cose::Sign1Message::GetPayload((Sign1Message *)local_268,(size_t *)&domainName)
        ;
        if ((uint8_t *)payloadLength == (uint8_t *)0x0) {
          ValidateToken::anon_class_1_0_00000001::operator()(&local_3da);
          local_170 = &local_3d8;
          local_178 = &local_3d9;
          bVar5 = ::fmt::v10::operator()(local_178);
          local_3d0 = bVar5.size_;
          local_3d8 = (v10 *)bVar5.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_1e0 = &local_3c8;
          local_1f0 = local_3d8;
          sStack_1e8 = local_3d0;
          local_d0 = &local_1f0;
          local_200 = local_3d8;
          local_1f8 = local_3d0;
          local_c8 = local_200;
          sStack_c0 = local_1f8;
          error = (Error *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
          local_80 = local_210;
          local_88 = &error;
          local_70 = 0;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)local_88;
          fmt_00.size_ = 0;
          fmt_00.data_ = (char *)local_1f8;
          local_78 = local_88;
          local_68 = local_80;
          local_60 = local_88;
          ::fmt::v10::vformat_abi_cxx11_(&local_3c8,local_200,fmt_00,args_00);
          Error::Error(&local_3a8,kBadFormat,&local_3c8);
          Error::operator=(__return_storage_ptr__,&local_3a8);
          Error::~Error(&local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
        }
        else {
          CborValue::Deserialize
                    (&local_408,(CborValue *)&payload,(uint8_t *)payloadLength,(size_t)domainName);
          pEVar4 = Error::operator=(__return_storage_ptr__,&local_408);
          local_40c = kNone;
          bVar3 = commissioner::operator!=(pEVar4,&local_40c);
          Error::~Error(&local_408);
          if (!bVar3) {
            CborMap::Get(&local_438,(CborMap *)&payload,3,(char **)&domainNameLength,
                         (size_t *)&expire);
            pEVar4 = Error::operator=(__return_storage_ptr__,&local_438);
            local_43c = kNone;
            bVar3 = commissioner::operator!=(pEVar4,&local_43c);
            Error::~Error(&local_438);
            if (!bVar3) {
              CborMap::Get(&local_468,(CborMap *)&payload,4,(char **)&expireLength,&local_2c0);
              pEVar4 = Error::operator=(__return_storage_ptr__,&local_468);
              local_46c = kNone;
              bVar3 = commissioner::operator!=(pEVar4,&local_46c);
              Error::~Error(&local_468);
              sVar2 = domainNameLength;
              pcVar1 = expire;
              if (!bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_490,(char *)sVar2,(ulong)pcVar1,&local_491);
                bVar3 = std::operator!=(&local_490,&this->mDomainName);
                std::__cxx11::string::~string((string *)&local_490);
                std::allocator<char>::~allocator((allocator<char> *)&local_491);
                if (bVar3) {
                  ValidateToken::anon_class_1_0_00000001::operator()(&local_4f2);
                  local_f8 = &local_4f0;
                  local_100 = &local_4f1;
                  bVar5 = ::fmt::v10::operator()(local_100);
                  local_4e8 = (char *)bVar5.size_;
                  local_4f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              bVar5.data_;
                  ::fmt::v10::detail::
                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                            ();
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_518,(char *)domainNameLength,(ulong)expire,&local_519);
                  local_128 = &this->mDomainName;
                  local_108 = &local_4e0;
                  local_118 = local_4f0;
                  pcStack_110 = local_4e8;
                  local_120 = (v10 *)local_518;
                  local_50 = &local_118;
                  local_138 = local_4f0;
                  local_130 = local_4e8;
                  local_48 = local_138;
                  pcStack_40 = local_130;
                  ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string_const>
                            (&local_168,local_120,local_128,local_4f0);
                  local_30 = local_148;
                  local_38 = &local_168;
                  local_20 = 0xdd;
                  args_01.field_1.values_ = in_R9.values_;
                  args_01.desc_ = (unsigned_long_long)local_38;
                  fmt_01.size_ = 0xdd;
                  fmt_01.data_ = local_130;
                  local_28 = local_38;
                  local_18 = local_30;
                  local_10 = local_38;
                  ::fmt::v10::vformat_abi_cxx11_(&local_4e0,(v10 *)local_138,fmt_01,args_01);
                  Error::Error(&local_4c0,kSecurity,&local_4e0);
                  Error::operator=(__return_storage_ptr__,&local_4c0);
                  Error::~Error(&local_4c0);
                  std::__cxx11::string::~string((string *)&local_4e0);
                  std::__cxx11::string::~string(local_518);
                  std::allocator<char>::~allocator((allocator<char> *)&local_519);
                }
                else {
                  CborValue::Move(&aToken->super_CborValue,(CborValue *)&payload);
                }
              }
            }
          }
        }
      }
    }
  }
  CborValue::Free((CborValue *)&payload);
  cose::Sign1Message::Free((Sign1Message *)local_268);
  coseSign.mSign._7_1_ = 1;
  CborMap::~CborMap((CborMap *)&payload);
  cose::Sign1Message::~Sign1Message((Sign1Message *)local_268);
  if ((coseSign.mSign._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ValidateToken(CborMap                  &aToken,
                                  const ByteArray          &aSignedToken,
                                  const mbedtls_pk_context &aPublicKey) const
{
    Error              error;
    cose::Sign1Message coseSign;
    CborMap            token;
    const uint8_t     *payload;
    size_t             payloadLength;
    const char        *domainName;
    size_t             domainNameLength;
    const char        *expire;
    size_t             expireLength;

    VerifyOrExit(!aSignedToken.empty(), error = ERROR_INVALID_ARGS("the signed COM_TOK is empty"));
    SuccessOrExit(error = cose::Sign1Message::Deserialize(coseSign, aSignedToken));

    SuccessOrExit(error = coseSign.Validate(aPublicKey));

    VerifyOrExit((payload = coseSign.GetPayload(payloadLength)) != nullptr,
                 error = ERROR_BAD_FORMAT("cannot find payload in the signed COM_TOK"));

    SuccessOrExit(error = CborValue::Deserialize(token, payload, payloadLength));

    SuccessOrExit(error = token.Get(cwt::kAud, domainName, domainNameLength));

    SuccessOrExit(error = token.Get(cwt::kExp, expire, expireLength));

    // TODO(wgtdkp): make sure it is not expired

    // Ignore the "iss" (issuer) claim

    if (std::string{domainName, domainNameLength} != mDomainName)
    {
        ExitNow(error = ERROR_SECURITY("the Domain Name ({}) in COM_TOK doesn't match the configured Domain Name ({})",
                                       std::string{domainName, domainNameLength}, mDomainName));
    }

    CborValue::Move(aToken, token);

exit:
    token.Free();
    coseSign.Free();
    return error;
}